

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void check_perm(char *what,int n,int *perm)

{
  int *addr;
  char local_138 [8];
  char msg [256];
  int *marker;
  int i;
  int *perm_local;
  int n_local;
  char *what_local;
  
  addr = int32Malloc(n);
  for (marker._4_4_ = 0; (int)marker._4_4_ < n; marker._4_4_ = marker._4_4_ + 1) {
    addr[(int)marker._4_4_] = 0;
  }
  for (marker._4_4_ = 0; (int)marker._4_4_ < n; marker._4_4_ = marker._4_4_ + 1) {
    if ((addr[perm[(int)marker._4_4_]] == 1) || (n <= perm[(int)marker._4_4_])) {
      printf("%s: Not a valid PERM[%d] = %d\n",what,(ulong)marker._4_4_,
             (ulong)(uint)perm[(int)marker._4_4_]);
      sprintf(local_138,"%s at line %d in file %s\n","check_perm",0x264,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/util.c");
      superlu_abort_and_exit(local_138);
    }
    else {
      addr[perm[(int)marker._4_4_]] = 1;
    }
  }
  superlu_free(addr);
  printf("check_perm: %s: n %d\n",what,(ulong)(uint)n);
  return;
}

Assistant:

void check_perm(const char *what, int n, const int *perm)
{
    register int i;
    int          *marker;
    /*marker = (int *) calloc(n, sizeof(int));*/
    marker = int32Malloc(n);
    for (i = 0; i < n; ++i) marker[i] = 0;

    for (i = 0; i < n; ++i) {
	if ( marker[perm[i]] == 1 || perm[i] >= n ) {
	    printf("%s: Not a valid PERM[%d] = %d\n", what, i, perm[i]);
	    ABORT("check_perm");
	} else {
	    marker[perm[i]] = 1;
	}
    }

    SUPERLU_FREE(marker);
    printf("check_perm: %s: n %d\n", what, n);
}